

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O2

void __thiscall
ft::list<std::__cxx11::string,ft::allocator<std::__cxx11::string>>::
merge<bool(*)(std::__cxx11::string_const&,std::__cxx11::string_const&)>
          (list<std::__cxx11::string,ft::allocator<std::__cxx11::string>> *this,
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *x,_func_bool_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
             *comp)

{
  bool bVar1;
  __off64_t *in_R8;
  size_t in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  uint in_stack_ffffffffffffffa8;
  undefined **local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  undefined **local_40;
  listNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_38;
  
  if ((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)this == x) {
    return;
  }
  pbVar2 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this;
  do {
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             pbVar2[1]._M_string_length;
    while( true ) {
      if (x->m_size == 0) {
        return;
      }
      if ((pbVar2 != *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (this + 8)) && (bVar1 = (*comp)(&x->m_head->next->data,pbVar2), !bVar1))
      break;
      local_50 = &PTR__listIterator_0010dce0;
      local_38 = x->m_head->next;
      local_40 = &PTR__listIterator_0010dce0;
      local_48 = pbVar2;
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::splice((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this,(int)&local_50,(__off64_t *)x,(int)&local_40,in_R8,in_R9,
               in_stack_ffffffffffffffa8);
    }
  } while( true );
}

Assistant:

void merge(list & x, Compare comp) {
		if (this != &x) {
			iterator	it = this->begin();
			while (!x.empty()) {
				if (it == this->end() || comp(*(x.begin()), *it)) this->splice(it, x, x.begin());
				else ++it;
			}
		}
	}